

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O2

void __thiscall
JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG
          (JointPolicyPureVectorForClusteredBG *this,
          shared_ptr<const_BayesianGameIdenticalPayoffInterface> *pu,PolicyDomainCategory idc,
          JPPVfCBG_constPtr *prevJPolBG,double r)

{
  int *piVar1;
  sp_counted_base *psVar2;
  E *pEVar3;
  BGwCI_constPtr bg;
  
  bg.px = (element_type *)pu->px;
  bg.pn.pi_ = (pu->pn).pi_;
  psVar2 = (pu->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  PartialJointPolicyPureVector::PartialJointPolicyPureVector
            (&this->super_PartialJointPolicyPureVector,(I_PtPDpure_constPtr *)&bg,TYPE_INDEX,r,
             999999);
  boost::detail::shared_count::~shared_count(&bg.pn);
  (this->super_PartialJointPolicyPureVector).super_PartialJointPolicyDiscretePure.
  super_JointPolicyDiscretePure.super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy =
       (_func_int **)&PTR_operator__005d87c8;
  (this->super_PartialJointPolicyPureVector).super_JPolComponent_VectorImplementation.
  _vptr_JPolComponent_VectorImplementation = (_func_int **)&DAT_005d88b0;
  (this->_m_bg).px = (element_type *)0x0;
  (this->_m_bg).pn.pi_ = (sp_counted_base *)0x0;
  boost::shared_ptr<const_JointPolicyPureVectorForClusteredBG>::shared_ptr
            (&this->_m_prevJPolBG,prevJPolBG);
  if (idc == TYPE_INDEX) {
    boost::
    dynamic_pointer_cast<BayesianGameWithClusterInfo_const,BayesianGameIdenticalPayoffInterface_const>
              ((boost *)&bg,pu);
    if (bg.px != (element_type *)0x0) {
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=(&this->_m_bg,&bg);
      boost::detail::shared_count::~shared_count(&bg.pn);
      return;
    }
    pEVar3 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar3,
         "JointPolicyPureVectorForClusteredBG can only be constructed with a BayesianGameWithClusterInfo"
        );
    __cxa_throw(pEVar3,&E::typeinfo,E::~E);
  }
  pEVar3 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar3,"JointPolicyPureVectorForClusteredBG should have TYPE_INDEX as domain category");
  __cxa_throw(pEVar3,&E::typeinfo,E::~E);
}

Assistant:

JointPolicyPureVectorForClusteredBG::JointPolicyPureVectorForClusteredBG(
        const boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> &pu,
        PolicyGlobals::PolicyDomainCategory idc,
        JPPVfCBG_constPtr prevJPolBG,
        double r)
    : 
    PartialJointPolicyPureVector( pu, PolicyGlobals::TYPE_INDEX, r ),
    _m_bg(),
    _m_prevJPolBG(prevJPolBG)
{
    if(idc!=PolicyGlobals::TYPE_INDEX)
        throw(E("JointPolicyPureVectorForClusteredBG should have TYPE_INDEX as domain category"));

    BGwCI_constPtr bg = boost::dynamic_pointer_cast<const BayesianGameWithClusterInfo>(pu);
    if(bg==0)
        throw(E("JointPolicyPureVectorForClusteredBG can only be constructed with a BayesianGameWithClusterInfo"));
    _m_bg=bg;
}